

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingState<long,_long>::CalculateDeltaStats(BitpackingState<long,_long> *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long in_RDI;
  idx_t i_2;
  bool success;
  int64_t i_1;
  int64_t i;
  long bogus;
  bool can_do_all;
  bool local_4b;
  bool local_4a;
  bool local_49;
  ulong local_38;
  long local_28;
  long local_20;
  int64_t local_18;
  bool local_9;
  
  lVar3 = *(long *)(in_RDI + 0x8830);
  lVar2 = NumericLimits<long>::Maximum();
  if (((lVar3 <= lVar2) && (1 < *(ulong *)(in_RDI + 0x8810))) &&
     ((*(byte *)(in_RDI + 0x8860) & 1) != 0)) {
    local_9 = true;
    bVar1 = TrySubtractOperator::Operation<long,long,long>
                      (*(int64_t *)(in_RDI + 0x8828),*(int64_t *)(in_RDI + 0x8830),&local_18);
    local_49 = false;
    if (bVar1) {
      local_49 = TrySubtractOperator::Operation<long,long,long>
                           (*(int64_t *)(in_RDI + 0x8830),*(int64_t *)(in_RDI + 0x8828),&local_18);
    }
    local_9 = local_49;
    if (local_49 == false) {
      for (local_28 = 0; local_28 < *(long *)(in_RDI + 0x8810); local_28 = local_28 + 1) {
        bVar1 = TrySubtractOperator::Operation<long,long,long>
                          (*(int64_t *)(*(long *)(in_RDI + 0x4008) + local_28 * 8),
                           *(int64_t *)(*(long *)(in_RDI + 0x4008) + (local_28 + -1) * 8),
                           (int64_t *)(in_RDI + 0x4010 + local_28 * 8));
        if (!bVar1) {
          return;
        }
      }
    }
    else {
      for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x8810); local_20 = local_20 + 1) {
        *(long *)(in_RDI + 0x4010 + local_20 * 8) =
             *(long *)(*(long *)(in_RDI + 0x4008) + local_20 * 8) -
             *(long *)(*(long *)(in_RDI + 0x4008) + (local_20 + -1) * 8);
      }
    }
    *(undefined1 *)(in_RDI + 0x8862) = 1;
    for (local_38 = 1; local_38 < *(ulong *)(in_RDI + 0x8810); local_38 = local_38 + 1) {
      lVar3 = MaxValue<long>(*(long *)(in_RDI + 0x8848),*(long *)(in_RDI + 0x4010 + local_38 * 8));
      *(long *)(in_RDI + 0x8848) = lVar3;
      lVar3 = MinValue<long>(*(long *)(in_RDI + 0x8840),*(long *)(in_RDI + 0x4010 + local_38 * 8));
      *(long *)(in_RDI + 0x8840) = lVar3;
    }
    *(undefined8 *)(in_RDI + 0x4010) = *(undefined8 *)(in_RDI + 0x8840);
    local_4a = false;
    if ((*(byte *)(in_RDI + 0x8862) & 1) != 0) {
      local_4a = TrySubtractOperator::Operation<long,long,long>
                           (*(int64_t *)(in_RDI + 0x8848),*(int64_t *)(in_RDI + 0x8840),
                            (int64_t *)(in_RDI + 0x8850));
    }
    *(bool *)(in_RDI + 0x8862) = local_4a;
    local_4b = false;
    if ((*(byte *)(in_RDI + 0x8862) & 1) != 0) {
      local_4b = TrySubtractOperator::Operation<long,long,long>
                           (**(int64_t **)(in_RDI + 0x4008),*(int64_t *)(in_RDI + 0x8840),
                            (int64_t *)(in_RDI + 0x8858));
    }
    *(bool *)(in_RDI + 0x8862) = local_4b;
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}